

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawSchema * __thiscall capnp::SchemaLoader::Impl::load(Impl *this,Reader *reader,bool isPlaceholder)

{
  Initializer *pIVar1;
  bool bVar2;
  bool bVar3;
  Maybe<capnp::_::RawSchema_*&> MVar4;
  RawSchema *value;
  RawSchema **ppRVar5;
  uint16_t *puVar6;
  uint64_t uVar7;
  Which kind;
  InitializerImpl *pIVar8;
  InitializerImpl *key;
  InitializerImpl *pIVar9;
  ArrayPtr<capnp::word> AVar10;
  StringPtr name;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar11;
  Reader validatedReader;
  Reader existing;
  Validator validator;
  CompatibilityChecker checker;
  Reader local_1e8;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1b8;
  Reader local_1a0;
  Validator local_170;
  CompatibilityChecker local_b0;
  
  AVar10 = makeUncheckedNodeEnforcingSizeRequirements(this,(Reader)reader->_reader);
  Validator::Validator(&local_170,this);
  readMessageUnchecked<capnp::schema::Node>(&local_1e8,AVar10.ptr);
  bVar2 = Validator::validate(&local_170,&local_1e8);
  if (!bVar2) {
    if (local_1e8._reader.dataSize < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = *local_1e8._reader.data;
    }
    name.content = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_1e8);
    if (local_1e8._reader.dataSize < 0x70) {
      kind = FILE;
    }
    else {
      kind = *(Which *)((long)local_1e8._reader.data + 0xc);
    }
    value = loadEmpty(this,uVar7,name,kind,false);
    goto LAB_001a4b00;
  }
  if (local_1e8._reader.dataSize < 0x40) {
    local_b0.loader = (Impl *)0x0;
  }
  else {
    local_b0.loader = *local_1e8._reader.data;
  }
  MVar4 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::find<unsigned_long>
                    (&this->schemas,(unsigned_long *)&local_b0);
  if (MVar4.ptr == (RawSchema **)0x0) {
    value = kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
    (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
    (value->defaultBrand).dependencies = (Dependency *)0x0;
    (value->defaultBrand).scopeCount = 0;
    (value->defaultBrand).dependencyCount = 0;
    (value->defaultBrand).generic = (RawSchema *)0x0;
    (value->defaultBrand).scopes = (Scope *)0x0;
    if (local_1e8._reader.dataSize < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = *local_1e8._reader.data;
    }
    value->canCastTo = (RawSchema *)0x0;
    key = (InitializerImpl *)0x0;
    pIVar8 = &this->initializer;
    if (!isPlaceholder) {
      pIVar8 = key;
    }
    pIVar9 = (InitializerImpl *)&this->brandedInitializer;
    if (!isPlaceholder) {
      pIVar9 = key;
    }
    value->id = uVar7;
    (value->defaultBrand).generic = value;
    value->lazyInitializer = &pIVar8->super_Initializer;
    (value->defaultBrand).lazyInitializer = (Initializer *)pIVar9;
    if (0x3f < local_1e8._reader.dataSize) {
      key = *local_1e8._reader.data;
    }
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert
              (&this->schemas,(unsigned_long)key,value);
    bVar2 = false;
LAB_001a4a8b:
    value->encodedNode = AVar10.ptr;
    value->encodedSize = (uint32_t)AVar10.size_;
    ppRVar5 = Validator::makeDependencyArray(&local_170,&value->dependencyCount);
    value->dependencies = ppRVar5;
    puVar6 = Validator::makeMemberInfoArray(&local_170,&value->memberCount);
    value->membersByName = puVar6;
    value->membersByDiscriminant = local_170.membersByDiscriminant.ptr;
    local_1b8.ptr.field_1.value.ptr = (Scope *)0x0;
    local_1b8.ptr.field_1.value.size_ = 0;
    local_1b8.ptr.isSet = true;
    AVar11 = makeBrandedDependencies(this,value,&local_1b8);
    (value->defaultBrand).dependencies = AVar11.ptr;
    (value->defaultBrand).dependencyCount = (uint32_t)AVar11.size_;
  }
  else {
    value = *MVar4.ptr;
    pIVar1 = value->lazyInitializer;
    readMessageUnchecked<capnp::schema::Node>(&local_1a0,value->encodedNode);
    local_b0.nodeName.super_StringPtr.content.ptr = "";
    local_b0.nodeName.super_StringPtr.content.size_ = 1;
    local_b0.existingNode._reader.data = (void *)0x0;
    local_b0.existingNode._reader.pointers._0_6_ = 0;
    local_b0.existingNode._reader.pointers._6_2_ = 0;
    local_b0.existingNode._reader.dataSize = 0;
    local_b0.existingNode._reader.pointerCount = 0;
    local_b0.existingNode._reader.segment = (SegmentReader *)0x0;
    local_b0.existingNode._reader.capTable = (CapTableReader *)0x0;
    local_b0.existingNode._reader.nestingLimit = 0x7fffffff;
    local_b0.replacementNode._reader.data = (void *)0x0;
    local_b0.replacementNode._reader.pointers._0_6_ = 0;
    local_b0.replacementNode._reader.pointers._6_2_ = 0;
    local_b0.replacementNode._reader.dataSize = 0;
    local_b0.replacementNode._reader.pointerCount = 0;
    local_b0.replacementNode._reader.segment = (SegmentReader *)0x0;
    local_b0.replacementNode._reader.capTable = (CapTableReader *)0x0;
    local_b0.replacementNode._reader.nestingLimit = 0x7fffffff;
    local_b0.loader = this;
    bVar3 = CompatibilityChecker::shouldReplace
                      (&local_b0,&local_1a0,&local_1e8,value->lazyInitializer != (Initializer *)0x0)
    ;
    bVar2 = pIVar1 != (Initializer *)0x0 && !isPlaceholder;
    if (bVar3) goto LAB_001a4a8b;
  }
  if (bVar2) {
    value->lazyInitializer = (Initializer *)0x0;
    (value->defaultBrand).lazyInitializer = (Initializer *)0x0;
  }
LAB_001a4b00:
  Validator::~Validator(&local_170);
  return value;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::load(const schema::Node::Reader& reader, bool isPlaceholder) {
  // Make a copy of the node which can be used unchecked.
  kj::ArrayPtr<word> validated = makeUncheckedNodeEnforcingSizeRequirements(reader);

  // Validate the copy.
  Validator validator(*this);
  auto validatedReader = readMessageUnchecked<schema::Node>(validated.begin());

  if (!validator.validate(validatedReader)) {
    // Not valid.  Construct an empty schema of the same type and return that.
    return loadEmpty(validatedReader.getId(),
                     validatedReader.getDisplayName(),
                     validatedReader.which(),
                     false);
  }

  // Check if we already have a schema for this ID.
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_MAYBE(match, schemas.find(validatedReader.getId())) {
    // Yes, check if it is compatible and figure out which schema is newer.

    schema = *match;

    // If the existing schema is a placeholder, but we're upgrading it to a non-placeholder, we
    // need to clear the initializer later.
    shouldClearInitializer = schema->lazyInitializer != nullptr && !isPlaceholder;

    auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
    CompatibilityChecker checker(*this);

    // Prefer to replace the existing schema if the existing schema is a placeholder.  Otherwise,
    // prefer to keep the existing schema.
    shouldReplace = checker.shouldReplace(
        existing, validatedReader, schema->lazyInitializer != nullptr);
  } else {
    // Nope, allocate a new RawSchema.
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->id = validatedReader.getId();
    schema->canCastTo = nullptr;
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = isPlaceholder ? &initializer : nullptr;
    schema->defaultBrand.lazyInitializer = isPlaceholder ? &brandedInitializer : nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;
    schemas.insert(validatedReader.getId(), schema);
  }